

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

Matrix * __thiscall Matrix::operator[](Matrix *__return_storage_ptr__,Matrix *this,int i)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  int *sizes;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  shared_array<double> local_38;
  
  uVar5 = (ulong)(uint)this->nMatrixDimension;
  uVar6 = 1;
  if (uVar5 != 1) {
    uVar6 = (ulong)(this->nMatrixDimension - 1);
  }
  sizes = (int *)operator_new__(uVar6 * 4);
  *sizes = 1;
  if (1 < uVar5) {
    piVar2 = this->pSize;
    lVar4 = 0;
    do {
      sizes[lVar4] = piVar2[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (uVar5 - 1 != lVar4);
  }
  local_38.px = (this->matrixParent).px;
  iVar1 = *this->pMult;
  pdVar3 = this->pData;
  local_38.pn.pi_ = (this->matrixParent).pn.pi_;
  if (local_38.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_38.pn.pi_)->use_count_ = (local_38.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  Matrix(__return_storage_ptr__,pdVar3 + (long)i * (long)iVar1,&local_38,sizes,(int)uVar6);
  boost::detail::shared_count::~shared_count(&local_38.pn);
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::operator[](int i)
{
    uint dimension = uint(nMatrixDimension==1 ? 1 : nMatrixDimension-1);
    int *sizes = new int[dimension];
    sizes[0] = 1;
    for (uint s=1; s<uint(nMatrixDimension); s++)
		sizes[s-1] = pSize[s];
    return Matrix( &(pData[i*pMult[0]]), matrixParent, sizes, dimension );
}